

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * util::str<char[16],std::__cxx11::string,char[3],char*>
                   (char (*args) [16],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [3],char **args_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  ostringstream *this;
  ostream *in_stack_fffffffffffffe50;
  ostringstream local_1a0 [416];
  
  this = local_1a0;
  args_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  detail::_str<char[16],std::__cxx11::string,char[3],char*>
            (in_stack_fffffffffffffe50,(char (*) [16])this,args_00,(char (*) [3])in_RDI,
             (char **)0x11f2f4);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return args_00;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}